

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blake3_avx2.c
# Opt level: O3

void blake3_hash_many_avx2
               (uint8_t **inputs,size_t num_inputs,size_t blocks,uint32_t *key,uint64_t counter,
               _Bool increment_counter,uint8_t flags,uint8_t flags_start,uint8_t flags_end,
               uint8_t *out)

{
  if (7 < num_inputs) {
    do {
      blake3_hash8_avx2(inputs,blocks,key,counter,increment_counter,flags,flags_start,flags_end,out)
      ;
      if (increment_counter) {
        counter = counter + 8;
      }
      inputs = inputs + 8;
      num_inputs = num_inputs - 8;
      out = out + 0x100;
    } while (7 < num_inputs);
  }
  blake3_hash_many_sse41
            (inputs,num_inputs,blocks,key,counter,increment_counter,flags,flags_start,flags_end,out)
  ;
  return;
}

Assistant:

void blake3_hash_many_avx2(const uint8_t *const *inputs, size_t num_inputs,
                           size_t blocks, const uint32_t key[8],
                           uint64_t counter, bool increment_counter,
                           uint8_t flags, uint8_t flags_start,
                           uint8_t flags_end, uint8_t *out) {
  while (num_inputs >= DEGREE) {
    blake3_hash8_avx2(inputs, blocks, key, counter, increment_counter, flags,
                      flags_start, flags_end, out);
    if (increment_counter) {
      counter += DEGREE;
    }
    inputs += DEGREE;
    num_inputs -= DEGREE;
    out = &out[DEGREE * BLAKE3_OUT_LEN];
  }
#if !defined(BLAKE3_NO_SSE41)
  blake3_hash_many_sse41(inputs, num_inputs, blocks, key, counter,
                         increment_counter, flags, flags_start, flags_end, out);
#else
  blake3_hash_many_portable(inputs, num_inputs, blocks, key, counter,
                            increment_counter, flags, flags_start, flags_end,
                            out);
#endif
}